

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status
fdb_kvs_open(fdb_file_handle *fhandle,fdb_kvs_handle **ptr_handle,char *kvs_name,
            fdb_kvs_config *kvs_config)

{
  fdb_kvs_handle *handle_00;
  bool bVar1;
  int iVar2;
  undefined8 *__ptr;
  fdb_kvs_config *in_RCX;
  char *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  kvs_header *kvsh;
  void *default_kvs_cmp_param;
  fdb_custom_cmp_variable default_kvs_cmp;
  filemgr *latest_file;
  filemgr *file;
  fdb_kvs_config config_local;
  fdb_kvs_handle *root_handle;
  fdb_status fs;
  fdb_config config;
  fdb_kvs_handle *handle;
  fdb_config *in_stack_00001ab0;
  fdb_filename_mode_t in_stack_00001abc;
  char *in_stack_00001ac0;
  fdb_kvs_handle *in_stack_00001ac8;
  fdb_kvs_handle *in_stack_fffffffffffffe28;
  fdb_file_handle *in_stack_fffffffffffffe30;
  void **in_stack_fffffffffffffe38;
  fdb_file_handle *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  fdb_kvs_handle *in_stack_fffffffffffffe50;
  char *local_1a0;
  char *in_stack_fffffffffffffe70;
  kvs_header *pkVar3;
  char *in_stack_fffffffffffffe78;
  void *pvVar4;
  filemgr *in_stack_fffffffffffffe80;
  fdb_custom_cmp_variable p_Var5;
  fdb_kvs_handle *in_stack_fffffffffffffe88;
  fdb_config *in_stack_fffffffffffffe90;
  fdb_kvs_handle *in_stack_fffffffffffffe98;
  fdb_kvs_handle *handle_01;
  fdb_config *local_148;
  fdb_kvs_handle *local_140;
  fdb_kvs_handle *in_stack_fffffffffffffed8;
  byte local_e8;
  fdb_status local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    handle_00 = (fdb_kvs_handle *)*in_RDI;
    memcpy(&stack0xfffffffffffffed8,&handle_00->config,0xf8);
    if (in_RCX == (fdb_kvs_config *)0x0) {
      get_default_kvs_config();
      handle_01 = in_stack_fffffffffffffe88;
      local_148 = in_stack_fffffffffffffe90;
      local_140 = in_stack_fffffffffffffe98;
    }
    else {
      bVar1 = validate_fdb_kvs_config(in_RCX);
      if (!bVar1) {
        return FDB_RESULT_INVALID_CONFIG;
      }
      local_148 = (fdb_config *)in_RCX->custom_cmp;
      local_140 = (fdb_kvs_handle *)in_RCX->custom_cmp_param;
      handle_01 = *(fdb_kvs_handle **)in_RCX;
    }
    fdb_check_file_reopen(handle_00,(file_status_t *)0x0);
    fdb_sync_db_header(in_stack_fffffffffffffed8);
    if ((in_RDX == (char *)0x0) || (iVar2 = strcmp(in_RDX,default_kvs_name), iVar2 == 0)) {
      pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 4));
      if ((in_RDI[3] & 1U) == 0) {
        p_Var5 = (fdb_custom_cmp_variable)0x0;
        pvVar4 = (void *)0x0;
        *(fdb_kvs_handle **)&handle_00->kvs_config = handle_01;
        (handle_00->kvs_config).custom_cmp = (fdb_custom_cmp_variable)local_148;
        (handle_00->kvs_config).custom_cmp_param = local_140;
        if (handle_00->file->kv_header != (kvs_header *)0x0) {
          pkVar3 = handle_00->file->kv_header;
          fdb_kvs_find_cmp_name
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                     (fdb_custom_cmp_variable *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
          ;
          pthread_spin_lock(&pkVar3->lock);
          pkVar3->default_kvs_cmp = p_Var5;
          pkVar3->default_kvs_cmp_param = pvVar4;
          if ((pkVar3->default_kvs_cmp == (fdb_custom_cmp_variable)0x0) &&
             ((handle_00->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0)) {
            pkVar3->default_kvs_cmp = (handle_00->kvs_config).custom_cmp;
            pkVar3->default_kvs_cmp_param = (handle_00->kvs_config).custom_cmp_param;
            fdb_file_handle_add_cmp_func
                      (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                       (fdb_custom_cmp_variable)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
            ;
          }
          if (pkVar3->default_kvs_cmp != (fdb_custom_cmp_variable)0x0) {
            pkVar3->custom_cmp_enabled = '\x01';
            in_RDI[3] = in_RDI[3] | 4;
          }
          pthread_spin_unlock(&handle_00->file->kv_header->lock);
        }
        in_RDI[3] = in_RDI[3] | 2;
        in_RDI[3] = in_RDI[3] | 1;
      }
      pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 4));
      __ptr = (undefined8 *)calloc(1,0x208);
      *__ptr = handle_01;
      __ptr[1] = local_148;
      __ptr[2] = local_140;
      atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe30,
                          (uint8_t)((ulong)in_stack_fffffffffffffe28 >> 0x38));
      __ptr[5] = in_RDI;
      local_4 = _fdb_open(in_stack_00001ac8,in_stack_00001ac0,in_stack_00001abc,in_stack_00001ab0);
      if (local_4 == FDB_RESULT_SUCCESS) {
        _fdb_kvs_createNLinkKVHandle(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        *in_RSI = __ptr;
      }
      else {
        free(__ptr);
        *in_RSI = 0;
      }
    }
    else if ((local_e8 & 1) == 0) {
      local_1a0 = in_RDX;
      if (in_RDX == (char *)0x0) {
        local_1a0 = "default";
      }
      local_4 = fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_INVALID_CONFIG,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                             ,"fdb_kvs_open",0x70c,
                             "Cannot open KV store instance \'%s\' because multi-KV store instance mode is disabled."
                             ,local_1a0);
    }
    else if (handle_00->kvs->type == '\0') {
      if (handle_00->shandle == (snap_handle *)0x0) {
        pvVar4 = calloc(1,0x208);
        if (pvVar4 == (void *)0x0) {
          local_4 = FDB_RESULT_ALLOC_FAIL;
        }
        else {
          atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe30,
                              (uint8_t)((ulong)in_stack_fffffffffffffe28 >> 0x38));
          *(long **)((long)pvVar4 + 0x28) = in_RDI;
          local_4 = _fdb_kvs_open(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                  &in_stack_fffffffffffffe88->kvs_config,in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,handle_01);
          if (local_4 == FDB_RESULT_SUCCESS) {
            *in_RSI = pvVar4;
          }
          else {
            *in_RSI = 0;
            free(pvVar4);
          }
        }
      }
      else {
        if (in_RDX == (char *)0x0) {
          in_RDX = "default";
        }
        local_4 = fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_INVALID_ARGS,
                               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                               ,"fdb_kvs_open",0x71b,
                               "Not allowed to open KV store instance \'%s\' from the snapshot handle."
                               ,in_RDX);
      }
    }
    else {
      if (in_RDX == (char *)0x0) {
        in_RDX = "default";
      }
      local_4 = fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_INVALID_HANDLE,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                             ,"fdb_kvs_open",0x713,
                             "Cannot open KV store instance \'%s\' because the handle doesn\'t support multi-KV sotre instance mode."
                             ,in_RDX);
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_kvs_open(fdb_file_handle *fhandle,
                        fdb_kvs_handle **ptr_handle,
                        const char *kvs_name,
                        fdb_kvs_config *kvs_config)
{
    fdb_kvs_handle *handle;
    fdb_config config;
    fdb_status fs;
    fdb_kvs_handle *root_handle;
    fdb_kvs_config config_local;
    struct filemgr *file = NULL;
    struct filemgr *latest_file = NULL;
    LATENCY_STAT_START();

    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    root_handle = fhandle->root;
    config = root_handle->config;

    if (kvs_config) {
        if (validate_fdb_kvs_config(kvs_config)) {
            config_local = *kvs_config;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        config_local = get_default_kvs_config();
    }

    fdb_check_file_reopen(root_handle, NULL);
    fdb_sync_db_header(root_handle);

    file = root_handle->file;
    latest_file = root_handle->file;

    if (kvs_name == NULL || !strcmp(kvs_name, default_kvs_name)) {
        // return the default KV store handle
        spin_lock(&fhandle->lock);
        if (!(fhandle->flags & FHANDLE_ROOT_OPENED)) {
            // the root handle is not opened yet
            // sync up the root handle
            fdb_custom_cmp_variable default_kvs_cmp = NULL;
            void* default_kvs_cmp_param = NULL;

            root_handle->kvs_config = config_local;

            if (root_handle->file->kv_header) {
                struct kvs_header* kvsh = root_handle->file->kv_header;

                // search fhandle's custom cmp func list first
                fdb_kvs_find_cmp_name(root_handle,
                                      (char *)kvs_name,
                                      &default_kvs_cmp,
                                      &default_kvs_cmp_param);

                spin_lock(&kvsh->lock);
                kvsh->default_kvs_cmp = default_kvs_cmp;
                kvsh->default_kvs_cmp_param = default_kvs_cmp_param;

                if ( kvsh->default_kvs_cmp == NULL &&
                     root_handle->kvs_config.custom_cmp ) {
                    // follow kvs_config's custom cmp next
                    kvsh->default_kvs_cmp = root_handle->kvs_config.custom_cmp;
                    kvsh->default_kvs_cmp_param = root_handle->kvs_config.custom_cmp_param;
                    fdb_file_handle_add_cmp_func(fhandle,
                                                 NULL,
                                                 root_handle->kvs_config.custom_cmp,
                                                 root_handle->kvs_config.custom_cmp_param);
                }

                if (kvsh->default_kvs_cmp) {
                    kvsh->custom_cmp_enabled = 1;
                    fhandle->flags |= FHANDLE_ROOT_CUSTOM_CMP;
                }
                spin_unlock(&root_handle->file->kv_header->lock);
            }

            fhandle->flags |= FHANDLE_ROOT_INITIALIZED;
            fhandle->flags |= FHANDLE_ROOT_OPENED;
        }
        // the root handle is already synced
        // open new default KV store handle
        spin_unlock(&fhandle->lock);
        handle = (fdb_kvs_handle*)calloc(1, sizeof(fdb_kvs_handle));
        handle->kvs_config = config_local;
        atomic_init_uint8_t(&handle->handle_busy, 0);

        handle->fhandle = fhandle;
        fs = _fdb_open(handle, file->filename, FDB_AFILENAME, &config);
        if (fs != FDB_RESULT_SUCCESS) {
            free(handle);
            *ptr_handle = NULL;
        } else {
            // insert into fhandle's list
            _fdb_kvs_createNLinkKVHandle(fhandle, handle);
            *ptr_handle = handle;
        }
        LATENCY_STAT_END(file, FDB_LATENCY_KVS_OPEN);
        return fs;
    }

    if (config.multi_kv_instances == false) {
        // cannot open KV instance under single DB instance mode
        return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_INVALID_CONFIG,
                       "Cannot open KV store instance '%s' because multi-KV "
                       "store instance mode is disabled.",
                       kvs_name ? kvs_name : DEFAULT_KVS_NAME);
    }
    if (root_handle->kvs->type != KVS_ROOT) {
        return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_INVALID_HANDLE,
                       "Cannot open KV store instance '%s' because the handle "
                       "doesn't support multi-KV sotre instance mode.",
                       kvs_name ? kvs_name : DEFAULT_KVS_NAME);
    }
    if (root_handle->shandle) {
        // cannot open KV instance from a snapshot
        return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_INVALID_ARGS,
                       "Not allowed to open KV store instance '%s' from the "
                       "snapshot handle.",
                       kvs_name ? kvs_name : DEFAULT_KVS_NAME);
    }

    handle = (fdb_kvs_handle *)calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->fhandle = fhandle;
    fs = _fdb_kvs_open(root_handle, &config, &config_local,
                       latest_file, file->filename, kvs_name, handle);
    if (fs == FDB_RESULT_SUCCESS) {
        *ptr_handle = handle;
    } else {
        *ptr_handle = NULL;
        free(handle);
    }
    LATENCY_STAT_END(file, FDB_LATENCY_KVS_OPEN);
    return fs;
}